

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tty.c
# Opt level: O0

int uv_tty_reset_mode(void)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  int local_14;
  int err;
  int saved_errno;
  
  piVar3 = __errno_location();
  iVar1 = *piVar3;
  iVar2 = uv_spinlock_trylock(&termios_spinlock);
  if (iVar2 == 0) {
    err = -0x10;
  }
  else {
    local_14 = 0;
    if ((orig_termios_fd != -1) &&
       (iVar2 = tcsetattr(orig_termios_fd,0,(termios *)&orig_termios), iVar2 != 0)) {
      piVar3 = __errno_location();
      local_14 = -*piVar3;
    }
    uv_spinlock_unlock(&termios_spinlock);
    piVar3 = __errno_location();
    *piVar3 = iVar1;
    err = local_14;
  }
  return err;
}

Assistant:

int uv_tty_reset_mode(void) {
  int saved_errno;
  int err;

  saved_errno = errno;
  if (!uv_spinlock_trylock(&termios_spinlock))
    return -EBUSY;  /* In uv_tty_set_mode(). */

  err = 0;
  if (orig_termios_fd != -1)
    if (tcsetattr(orig_termios_fd, TCSANOW, &orig_termios))
      err = -errno;

  uv_spinlock_unlock(&termios_spinlock);
  errno = saved_errno;

  return err;
}